

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

void __thiscall cppgenerate::Class::print(Class *this,ostream *output,bool headerOnly)

{
  pointer pPVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  CodeBlock *pCVar4;
  ostringstream *poVar5;
  bool bVar6;
  undefined7 in_register_00000011;
  char *pcVar7;
  pointer pPVar8;
  allocator local_305;
  undefined4 local_304;
  string *local_300;
  string classNameUpper;
  string include;
  AccessModifier local_2b8;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  CodeBlock block;
  
  local_304 = (undefined4)CONCAT71(in_register_00000011,headerOnly);
  CodeBlock::CodeBlock(&block);
  std::__cxx11::string::string((string *)&local_1d0,(string *)this);
  uppercase(&classNameUpper,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar2 = std::operator<<(output,"#ifndef ");
  poVar2 = std::operator<<(poVar2,(string *)&classNameUpper);
  poVar2 = std::operator<<(poVar2,"_H");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(output,"#define ");
  poVar2 = std::operator<<(poVar2,(string *)&classNameUpper);
  poVar2 = std::operator<<(poVar2,"_H");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (p_Var3 = (this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_systemIncludes)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string((string *)&include,(string *)(p_Var3 + 1));
    poVar2 = std::operator<<(output,"#include <");
    poVar2 = std::operator<<(poVar2,(string *)&include);
    poVar2 = std::operator<<(poVar2,">");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&include);
  }
  for (p_Var3 = (this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_localIncludes)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string((string *)&include,(string *)(p_Var3 + 1));
    poVar2 = std::operator<<(output,"#include \"");
    poVar2 = std::operator<<(poVar2,(string *)&include);
    poVar2 = std::operator<<(poVar2,"\"");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&include);
  }
  local_300 = (string *)&this->m_namespace;
  if (1 < (this->m_namespace)._M_string_length) {
    poVar2 = std::operator<<(output,"namespace ");
    poVar2 = std::operator<<(poVar2,local_300);
    poVar2 = std::operator<<(poVar2," {");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if ((this->m_documentation)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_1f0,"/*",(allocator *)&include);
    pCVar4 = CodeBlock::addLine(&block,&local_1f0);
    std::__cxx11::string::string((string *)&local_210,(string *)&this->m_documentation);
    pCVar4 = CodeBlock::addLine(pCVar4,&local_210);
    std::__cxx11::string::string((string *)&local_230,"*/",&local_305);
    CodeBlock::addLine(pCVar4,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::operator+(&local_250,"class ",&this->m_className);
  CodeBlock::addLine(&block,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  if ((this->m_parents).
      super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_parents).
      super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
    std::operator<<((ostream *)poVar5," : ");
    pPVar1 = (this->m_parents).
             super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = false;
    for (pPVar8 = (this->m_parents).
                  super__Vector_base<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar8 != pPVar1; pPVar8 = pPVar8 + 1)
    {
      Parent::Parent((Parent *)&include,pPVar8);
      if (bVar6) {
        poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
        std::operator<<((ostream *)poVar5,", ");
      }
      if (local_2b8 == PROTECTED) {
        poVar2 = (ostream *)CodeBlock::buffer_abi_cxx11_(&block);
        pcVar7 = "protected ";
LAB_001101c2:
        std::operator<<(poVar2,pcVar7);
      }
      else if (local_2b8 == PUBLIC) {
        poVar2 = (ostream *)CodeBlock::buffer_abi_cxx11_(&block);
        pcVar7 = "public ";
        goto LAB_001101c2;
      }
      poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
      poVar2 = std::operator<<((ostream *)poVar5,(string *)&include);
      std::operator<<(poVar2," ");
      Parent::~Parent((Parent *)&include);
      bVar6 = true;
    }
  }
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  poVar2 = std::operator<<((ostream *)poVar5,"{");
  std::endl<char,std::char_traits<char>>(poVar2);
  if (this->m_isQobject == true) {
    pCVar4 = CodeBlock::indent(&block);
    std::__cxx11::string::string((string *)&local_270,"Q_OBJECT",(allocator *)&include);
    pCVar4 = CodeBlock::addLine(pCVar4,&local_270);
    CodeBlock::unindent(pCVar4);
    std::__cxx11::string::~string((string *)&local_270);
  }
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  bVar6 = (bool)((byte)local_304 ^ 1);
  printConstructors(this,(ostream *)poVar5,PUBLIC,bVar6);
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  printConstructors(this,(ostream *)poVar5,PROTECTED,bVar6);
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  printConstructors(this,(ostream *)poVar5,PRIVATE,bVar6);
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  printMethods(this,(ostream *)poVar5,PUBLIC,bVar6);
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  printMethods(this,(ostream *)poVar5,PROTECTED,bVar6);
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  printMethods(this,(ostream *)poVar5,PRIVATE,bVar6);
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  printVariables(this,(ostream *)poVar5,PUBLIC);
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  printVariables(this,(ostream *)poVar5,PROTECTED);
  poVar5 = CodeBlock::buffer_abi_cxx11_(&block);
  printVariables(this,(ostream *)poVar5,PRIVATE);
  std::__cxx11::string::string((string *)&local_290,"};",(allocator *)&include);
  CodeBlock::addLine(&block,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  CodeBlock::print(&block,output);
  if (1 < (this->m_namespace)._M_string_length) {
    poVar2 = std::operator<<(output,"} /* namespace ");
    poVar2 = std::operator<<(poVar2,local_300);
    poVar2 = std::operator<<(poVar2," */");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<(output,"#endif /* ");
  poVar2 = std::operator<<(poVar2,(string *)&classNameUpper);
  poVar2 = std::operator<<(poVar2,"_H */");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&classNameUpper);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&block);
  return;
}

Assistant:

void Class::print( std::ostream& output, bool headerOnly ) const {
    cppgenerate::CodeBlock block;
    std::string classNameUpper = cppgenerate::uppercase( m_className );

    output << "#ifndef " << classNameUpper << "_H" << std::endl;
    output << "#define " << classNameUpper << "_H" << std::endl << std::endl;

    for( std::string include : m_systemIncludes ){
        output << "#include <" << include << ">" << std::endl;
    }

    for( std::string include : m_localIncludes ){
        output << "#include \"" << include << "\"" << std::endl;
    }

    if( m_namespace.size() > 1 ){
        output << "namespace " << m_namespace << " {" << std::endl;
    }

    if( m_documentation.size() > 0 ){
        block.addLine( "/*" )
            .addLine( m_documentation )
            .addLine( "*/" );
    }
    block.addLine( "class " + m_className );

    if( m_parents.size() > 0 ){
        bool comma = false;
        block.buffer() << " : ";
        for( Parent parent : m_parents ){
            if( comma ) block.buffer() << ", ";
            switch( parent.inheritanceType ){
            case cppgenerate::AccessModifier::PUBLIC:
                block.buffer() << "public ";
                break;
            case cppgenerate::AccessModifier::PROTECTED:
                block.buffer() << "protected ";
                break;
            default:
                break;
            }
            block.buffer() << parent.parentName << " ";
            comma = true;
        }
    }

    block.buffer() << "{" << std::endl;

    if( m_isQobject ){
        block.indent()
            .addLine( "Q_OBJECT" )
            .unindent();
    }


    printConstructors( block.buffer(), AccessModifier::PUBLIC, !headerOnly );
    printConstructors( block.buffer(), AccessModifier::PROTECTED, !headerOnly );
    printConstructors( block.buffer(), AccessModifier::PRIVATE, !headerOnly );

    printMethods( block.buffer(), AccessModifier::PUBLIC, !headerOnly );
    printMethods( block.buffer(), AccessModifier::PROTECTED, !headerOnly );
    printMethods( block.buffer(), AccessModifier::PRIVATE, !headerOnly );

    printVariables( block.buffer(), AccessModifier::PUBLIC );
    printVariables( block.buffer(), AccessModifier::PROTECTED );
    printVariables( block.buffer(), AccessModifier::PRIVATE );


    block.addLine( "};" );

    block.print( output );

    if( m_namespace.size() > 1 ){
        output << "} /* namespace " << m_namespace << " */" << std::endl;
    }

    output << "#endif /* " << classNameUpper << "_H */" << std::endl;
}